

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausRunSat(Clu_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  undefined1 auVar3 [16];
  int iVar4;
  lit *begin;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  uVar1 = p->nFrames;
  uVar6 = uVar1 + 1;
  begin = (lit *)malloc((long)(int)uVar6 << 2);
  auVar3 = _DAT_0093d220;
  pVVar2 = p->pAig->vCos;
  if (pVVar2->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (-1 < (int)uVar1) {
    iVar4 = p->pCnf->nVars;
    iVar5 = p->pCnf->pVarNums[*(int *)((long)*pVVar2->pArray + 0x24)] * 2;
    lVar10 = (ulong)uVar6 - 1;
    auVar8._8_4_ = (int)lVar10;
    auVar8._0_8_ = lVar10;
    auVar8._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0093d220;
    auVar9 = _DAT_0093d210;
    do {
      auVar11 = auVar9 ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                  auVar8._4_4_ < auVar11._4_4_) & 1)) {
        *(uint *)((long)begin + uVar7) = (uint)((ulong)uVar1 << 2 != uVar7) + iVar5;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        *(uint *)((long)begin + uVar7 + 4) =
             (uint)((ulong)uVar1 * 4 - 4 != uVar7) + iVar4 * 2 + iVar5;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      uVar7 = uVar7 + 8;
      iVar5 = iVar5 + iVar4 * 4;
    } while (((ulong)uVar6 * 4 + 4 & 0xfffffffffffffff8) != uVar7);
  }
  iVar4 = sat_solver_solve(p->pSatMain,begin,begin + (long)(int)uVar1 + 1,(long)p->nBTLimit,0,0,0);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  iVar5 = 1;
  if (iVar4 != -1) {
    if (iVar4 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                    ,0x8a,"int Fra_ClausRunSat(Clu_Man_t *)");
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Fra_ClausRunSat( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int * pLits;
    int i, RetValue;
    pLits = ABC_ALLOC( int, p->nFrames + 1 );
    // set the output literals
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i <= p->nFrames; i++ )
        pLits[i] = i * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObj->Id], i != p->nFrames ); 
    // try to solve the problem
    RetValue = sat_solver_solve( p->pSatMain, pLits, pLits + p->nFrames + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    ABC_FREE( pLits );
    if ( RetValue == l_False )
        return 1;
    // get the counter-example
    assert( RetValue == l_True );
    return 0;
}